

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine.c
# Opt level: O1

void glmc_rotated(vec4 *m,float angle,float *axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  fVar3 = cosf(angle);
  fVar4 = axis[2] * axis[2] + *axis * *axis + axis[1] * axis[1];
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar11 = 0.0;
  fVar8 = 0.0;
  fVar10 = 0.0;
  if (1.1920929e-07 <= fVar4) {
    fVar4 = 1.0 / fVar4;
    fVar11 = *axis * fVar4;
    fVar8 = fVar4 * (float)*(undefined8 *)(axis + 1);
    fVar10 = fVar4 * (float)((ulong)*(undefined8 *)(axis + 1) >> 0x20);
  }
  fVar4 = 1.0 - fVar3;
  fVar13 = fVar4 * fVar11;
  fVar14 = fVar4 * fVar8;
  fVar4 = fVar4 * fVar10;
  fVar5 = sinf(angle);
  fVar15 = fVar11 * fVar14 - fVar5 * fVar10;
  fVar9 = fVar11 * fVar4 + fVar8 * fVar5;
  fVar16 = fVar3 + fVar13 * fVar11;
  fVar17 = fVar5 * fVar10 + fVar13 * fVar8;
  fVar18 = fVar8 * fVar4 - fVar11 * fVar5;
  fVar12 = fVar13 * fVar10 - fVar8 * fVar5;
  fVar6 = fVar3 + fVar14 * fVar8;
  fVar7 = fVar11 * fVar5 + fVar14 * fVar10;
  fVar3 = fVar4 * fVar10 + fVar3;
  fVar4 = (*m)[0];
  fVar8 = (*m)[1];
  fVar10 = (*m)[2];
  fVar11 = m[1][0];
  fVar5 = m[1][1];
  fVar13 = m[1][2];
  fVar14 = m[2][0];
  fVar1 = m[2][1];
  fVar2 = m[2][2];
  (*m)[0] = fVar10 * fVar9 + fVar8 * fVar15 + fVar4 * fVar16;
  (*m)[1] = fVar10 * fVar18 + fVar8 * fVar6 + fVar4 * fVar17;
  (*m)[2] = fVar10 * fVar3 + fVar8 * fVar7 + fVar4 * fVar12;
  (*m)[3] = fVar10 * 0.0 + fVar8 * 0.0 + fVar4 * 0.0;
  m[1][0] = fVar13 * fVar9 + fVar5 * fVar15 + fVar11 * fVar16;
  m[1][1] = fVar13 * fVar18 + fVar5 * fVar6 + fVar11 * fVar17;
  m[1][2] = fVar13 * fVar3 + fVar5 * fVar7 + fVar11 * fVar12;
  m[1][3] = fVar13 * 0.0 + fVar5 * 0.0 + fVar11 * 0.0;
  m[2][0] = fVar2 * fVar9 + fVar1 * fVar15 + fVar14 * fVar16;
  m[2][1] = fVar2 * fVar18 + fVar1 * fVar6 + fVar14 * fVar17;
  m[2][2] = fVar2 * fVar3 + fVar1 * fVar7 + fVar14 * fVar12;
  m[2][3] = fVar2 * 0.0 + fVar1 * 0.0 + fVar14 * 0.0;
  *(float *)((long)(m + 3) + 0) = 0.0;
  *(float *)((long)(m + 3) + 4) = 0.0;
  *(float *)((long)(m + 3) + 8) = 0.0;
  *(float *)((long)(m + 3) + 0xc) = 1.0;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_rotated(mat4 m, float angle, vec3 axis) {
  glm_rotated(m, angle, axis);
}